

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall
ThreadContext::GetOrAddPropertyId
          (ThreadContext *this,CharacterBuffer<char16_t> *propertyName,PropertyRecord **propRecord)

{
  PropertyRecord *pPVar1;
  CharacterBuffer<char16_t> local_38;
  
  EnterPinnedScope(propRecord);
  JsUtil::CharacterBuffer<char16_t>::CharacterBuffer(&local_38,propertyName);
  pPVar1 = GetOrAddPropertyRecord(this,&local_38);
  *propRecord = pPVar1;
  LeavePinnedScope();
  return;
}

Assistant:

void ThreadContext::GetOrAddPropertyId(_In_ JsUtil::CharacterBuffer<WCHAR> const& propertyName, _Out_ Js::PropertyRecord const ** propRecord)
{
    EnterPinnedScope((volatile void **)propRecord);
    *propRecord = GetOrAddPropertyRecord(propertyName);
    LeavePinnedScope();
}